

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O1

bool __thiscall Jinx::Variant::CanConvertTo(Variant *this,ValueType type)

{
  bool bVar1;
  Variant v;
  Variant VStack_38;
  
  bVar1 = true;
  if ((type != Null) && (this->m_type != type)) {
    Copy(&VStack_38,this);
    bVar1 = ConvertTo(&VStack_38,type);
    Destroy(&VStack_38);
  }
  return bVar1;
}

Assistant:

inline_t bool Variant::CanConvertTo(ValueType type) const
	{
		if (m_type == type || type == ValueType::Null)
			return true;
		Variant v = *this;
		return v.ConvertTo(type);
	}